

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileByName
          (MergedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  pointer ppDVar1;
  char cVar2;
  int iVar3;
  pointer ppDVar4;
  bool bVar5;
  
  ppDVar4 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppDVar1 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = ppDVar4 != ppDVar1;
  if (bVar5) {
    iVar3 = (*(*ppDVar4)->_vptr_DescriptorDatabase[2])();
    cVar2 = (char)iVar3;
    while (cVar2 == '\0') {
      ppDVar4 = ppDVar4 + 1;
      bVar5 = ppDVar4 != ppDVar1;
      if (ppDVar4 == ppDVar1) {
        return bVar5;
      }
      iVar3 = (*(*ppDVar4)->_vptr_DescriptorDatabase[2])(*ppDVar4,filename,output);
      cVar2 = (char)iVar3;
    }
  }
  return bVar5;
}

Assistant:

bool MergedDescriptorDatabase::FindAllFileNames(
    std::vector<std::string>* output) {
  bool implemented = false;
  for (DescriptorDatabase* source : sources_) {
    std::vector<std::string> source_output;
    if (source->FindAllFileNames(&source_output)) {
      output->reserve(output->size() + source_output.size());
      for (auto& source_out : source_output) {
        output->push_back(std::move(source_out));
      }
      implemented = true;
    }
  }
  return implemented;
}